

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::ScalarReplacementPass::GetStorageType(ScalarReplacementPass *this,Instruction *inst)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  uint uVar4;
  
  if (inst->opcode_ == OpVariable) {
    uVar2 = 0;
    if (inst->has_type_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(inst,0);
    }
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    pIVar3 = analysis::DefUseManager::GetDef
                       ((pIVar1->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar2);
    uVar4 = (pIVar3->has_result_id_ & 1) + 1;
    if (pIVar3->has_type_id_ == false) {
      uVar4 = (uint)pIVar3->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(pIVar3,uVar4 + 1);
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    pIVar3 = analysis::DefUseManager::GetDef
                       ((pIVar1->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar2);
    return pIVar3;
  }
  __assert_fail("inst->opcode() == spv::Op::OpVariable",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x255,
                "Instruction *spvtools::opt::ScalarReplacementPass::GetStorageType(const Instruction *) const"
               );
}

Assistant:

Instruction* ScalarReplacementPass::GetStorageType(
    const Instruction* inst) const {
  assert(inst->opcode() == spv::Op::OpVariable);

  uint32_t ptrTypeId = inst->type_id();
  uint32_t typeId =
      get_def_use_mgr()->GetDef(ptrTypeId)->GetSingleWordInOperand(1u);
  return get_def_use_mgr()->GetDef(typeId);
}